

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O2

int run_test_loop_update_time(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  uVar3 = uv_now(puVar2);
  do {
    puVar2 = uv_default_loop();
    uVar4 = uv_now(puVar2);
    if (999 < uVar4 - uVar3) {
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      eval_a = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar6 = "uv_loop_close(uv_default_loop())";
      pcVar5 = "0";
      uVar7 = 0x21;
      goto LAB_001555c3;
    }
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
  } while (eval_a == 0);
  pcVar6 = "0";
  pcVar5 = "uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
  uVar7 = 0x1f;
LAB_001555c3:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-time.c"
          ,uVar7,pcVar5,"==",pcVar6,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}